

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O2

bool __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
::is_non_zero(List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
              *this,ID_index rowIndex)

{
  _List_node_base *p_Var1;
  Column_support *pCVar2;
  
  pCVar2 = &this->column_;
  p_Var1 = (_List_node_base *)pCVar2;
  do {
    p_Var1 = (((_List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
                *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)pCVar2) break;
  } while (*(ID_index *)((long)p_Var1[1]._M_next + 4) != rowIndex);
  return p_Var1 != (_List_node_base *)pCVar2;
}

Assistant:

inline bool List_column<Master_matrix>::is_non_zero(ID_index rowIndex) const
{
  // could be changed to dichotomic search as column is ordered by row index,
  // but I am not sure if it is really worth it as there is no random access
  // and the columns should not be that long anyway.
  for (const Entry* entry : column_)
    if (entry->get_row_index() == rowIndex) return true;

  return false;
}